

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucs2fontmap.c
# Opt level: O1

int ucs2fontmap(char *s,uint ucs,int enc)

{
  char cVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  Summary16 *pSVar6;
  uchar *puVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  
  bVar9 = (byte)ucs;
  switch(enc) {
  case 0:
    *(ushort *)s = (ushort)ucs << 8 | (ushort)ucs >> 8;
    return 0;
  case 1:
    if (ucs - 1 < 0xff) {
      *s = '\0';
      s[1] = bVar9;
      return 1;
    }
    break;
  case 2:
    if (ucs < 0xa1) {
      *s = '\0';
      s[1] = bVar9;
      return 2;
    }
    if (0x17f < ucs) {
      if ((ucs & 0xffffffe0) != 0x2c0) {
        return -1;
      }
      *s = '\0';
      uVar10 = (ulong)(ucs - 0x2c0);
      s[1] = ""[uVar10];
      iVar4 = 2;
      uVar8 = 0xd4ffff7f;
LAB_001fc304:
      if ((uVar8 >> (uVar10 & 0x3f) & 1) != 0) {
        return -1;
      }
      return iVar4;
    }
    *s = '\0';
    uVar2 = iso8859_2_page00[ucs - 0xa0];
    s[1] = uVar2;
    iVar4 = 2;
    goto LAB_001fbfb9;
  case 3:
    if (ucs < 0xa0) {
      *s = bVar9;
      return 3;
    }
    if (ucs < 0x100) {
      uVar3 = ucs - 0xa0;
      puVar7 = iso8859_3_page00;
LAB_001fc004:
      puVar7 = puVar7 + uVar3;
LAB_001fc355:
      uVar2 = *puVar7;
    }
    else {
      if (ucs - 0x108 < 0x78) {
        puVar7 = iso8859_3_page01 + (ucs - 0x108);
        goto LAB_001fc355;
      }
      if ((ucs & 0xfffffff8) == 0x2d8) {
        uVar3 = ucs - 0x2d8;
        puVar7 = iso8859_3_page02;
        goto LAB_001fc004;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 3;
    }
    break;
  case 4:
    if (ucs < 0xa0) {
      *s = bVar9;
      return 4;
    }
    if (ucs < 0x180) {
      uVar3 = ucs - 0xa0;
      puVar7 = iso8859_4_page00;
LAB_001fc24a:
      uVar2 = puVar7[uVar3];
    }
    else {
      if ((ucs & 0xffffffe0) == 0x2c0) {
        uVar3 = ucs - 0x2c0;
        puVar7 = "";
        goto LAB_001fc24a;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 4;
    }
    break;
  case 5:
    if (ucs < 0xa0) {
      *s = bVar9;
    }
    else {
      if (ucs < 0xb0) {
        uVar2 = iso8859_5_page00[ucs - 0xa0];
      }
      else if (ucs - 0x400 < 0x60) {
        uVar2 = ""[ucs - 0x400];
      }
      else {
        uVar2 = (ucs != 0x2116) * '\x10' + 0xf0;
      }
      if (uVar2 == '\0') {
        return -1;
      }
      *s = uVar2;
    }
    return 5;
  case 6:
    if (ucs < 0xa0) {
      *s = bVar9;
      return 6;
    }
    if (ucs < 0xb0) {
      puVar7 = iso8859_6_page00 + (ucs - 0xa0);
LAB_001fc4f9:
      uVar2 = *puVar7;
    }
    else {
      if (ucs - 0x608 < 0x50) {
        puVar7 = "" + (ucs - 0x608);
        goto LAB_001fc4f9;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 6;
    }
    break;
  case 7:
    if (ucs < 0xa0) {
      *s = bVar9;
      return 7;
    }
    if (ucs < 0xc0) {
      uVar3 = ucs - 0xa0;
      puVar7 = iso8859_7_page00;
LAB_001fc025:
      puVar7 = puVar7 + uVar3;
LAB_001fc382:
      uVar2 = *puVar7;
    }
    else {
      if (ucs - 0x380 < 0x50) {
        puVar7 = "" + (ucs - 0x380);
        goto LAB_001fc382;
      }
      if ((ucs & 0xfffffff0) == 0x2010) {
        uVar3 = ucs - 0x2010;
        puVar7 = "";
        goto LAB_001fc025;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 7;
    }
    break;
  case 8:
    if (ucs < 0xa0) {
      *s = bVar9;
      return 8;
    }
    if (ucs < 0xf8) {
      puVar7 = iso8859_8_page00 + (ucs - 0xa0);
LAB_001fc7a8:
      uVar2 = *puVar7;
    }
    else {
      uVar3 = ucs - 0x5d0;
      if (uVar3 < 0x20) {
        puVar7 = iso8859_8_page05;
LAB_001fc7a5:
        puVar7 = puVar7 + uVar3;
        goto LAB_001fc7a8;
      }
      uVar3 = ucs - 0x2008;
      if (uVar3 < 0x10) {
        puVar7 = "";
        goto LAB_001fc7a5;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 8;
    }
    break;
  case 9:
    if (ucs < 0xd0) {
      *s = bVar9;
      return 9;
    }
    if (ucs < 0x100) {
      puVar7 = "" + (ucs - 0xd0);
LAB_001fc29c:
      uVar2 = *puVar7;
    }
    else {
      if (ucs - 0x118 < 0x48) {
        puVar7 = "" + (ucs - 0x118);
        goto LAB_001fc29c;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 9;
    }
    break;
  case 10:
    if (ucs < 0xa0) {
      *s = bVar9;
    }
    else {
      if (ucs < 0x180) {
        uVar2 = iso8859_10_page00[ucs - 0xa0];
      }
      else {
        uVar2 = 0xbd;
        if (ucs != 0x2015) {
          uVar2 = '\0';
        }
      }
      if (uVar2 == '\0') {
        return -1;
      }
      *s = uVar2;
    }
    return 10;
  case 0xb:
    if (ucs < 0xa0) {
      *s = bVar9;
      return 0xb;
    }
    if (ucs < 0x180) {
      uVar3 = ucs - 0xa0;
      puVar7 = iso8859_13_page00;
LAB_001fc223:
      uVar2 = puVar7[uVar3];
    }
    else {
      if ((ucs & 0xfffffff8) == 0x2018) {
        uVar3 = ucs - 0x2018;
        puVar7 = "";
        goto LAB_001fc223;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 0xb;
    }
    break;
  case 0xc:
    if (ucs < 0xa0) {
      *s = bVar9;
      return 0xc;
    }
    if (ucs < 0x100) {
      uVar8 = (ulong)(ucs - 0xa0);
      puVar7 = iso8859_14_page00;
LAB_001fbf24:
      puVar7 = puVar7 + uVar8;
LAB_001fc26f:
      uVar2 = *puVar7;
    }
    else {
      uVar3 = ucs - 0x108;
      if (uVar3 < 0x20) {
        puVar7 = "";
LAB_001fc26c:
        puVar7 = puVar7 + uVar3;
        goto LAB_001fc26f;
      }
      if ((ucs & 0xfffffff0) == 0x170) {
        uVar8 = (ulong)(ucs - 0x170);
        puVar7 = "";
        goto LAB_001fbf24;
      }
      uVar3 = ucs - 0x1e00;
      if (uVar3 < 0x88) {
        puVar7 = "";
        goto LAB_001fc26c;
      }
      if ((ucs & 0xfffffff8) == 0x1ef0) {
        uVar8 = (ulong)(ucs - 0x1ef0);
        puVar7 = "";
        goto LAB_001fbf24;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 0xc;
    }
    break;
  case 0xd:
    if (0x9f < ucs) {
      if (ucs < 0xc0) {
        ucs = (uint)iso8859_15_page00[ucs - 0xa0];
      }
      else if (0xff < ucs) {
        if (ucs - 0x150 < 0x30) {
          ucs = (uint)""[ucs - 0x150];
        }
        else {
          bVar11 = ucs != 0x20ac;
          ucs = 0xa4;
          if (bVar11) {
            ucs = 0;
          }
        }
      }
      if ((char)ucs == '\0') {
        return -1;
      }
    }
    *s = (char)ucs;
    return 0xd;
  case 0xe:
    if (ucs < 0x80) {
      *s = bVar9;
      return 0xe;
    }
    if (ucs - 0xa0 < 0x58) {
      uVar8 = (ulong)(ucs - 0xa0);
      puVar7 = koi8_r_page00;
LAB_001fc5ff:
      puVar7 = puVar7 + uVar8;
LAB_001fc602:
      uVar2 = *puVar7;
    }
    else {
      if (ucs - 0x400 < 0x58) {
        uVar8 = (ulong)(ucs - 0x400);
        puVar7 = "";
        goto LAB_001fc5ff;
      }
      if (ucs - 0x2218 < 0x50) {
        uVar8 = (ulong)(ucs - 0x2218);
        puVar7 = "";
        goto LAB_001fc5ff;
      }
      if ((ucs & 0xfffffff8) == 0x2320) {
        puVar7 = koi8_r_page23 + (ucs - 0x2320);
        goto LAB_001fc602;
      }
      if (ucs - 0x2500 < 0xa8) {
        uVar8 = (ulong)(ucs - 0x2500);
        puVar7 = koi8_r_page25;
        goto LAB_001fc5ff;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 0xe;
    }
    break;
  case 0xf:
    if (ucs < 0x100) {
      uVar8 = (ulong)(ucs >> 4);
      pSVar6 = big5_uni2indx_page00;
LAB_001fca82:
      pSVar6 = pSVar6 + uVar8;
    }
    else {
      if (ucs - 0x200 < 0x260) {
        uVar8 = (ulong)((ucs >> 4) - 0x20);
        pSVar6 = big5_uni2indx_page02;
        goto LAB_001fca82;
      }
      if (ucs - 0x2000 < 0x2c0) {
        uVar8 = (ulong)((ucs >> 4) - 0x200);
        pSVar6 = big5_uni2indx_page20;
        goto LAB_001fca82;
      }
      if (ucs - 0x2400 < 0x250) {
        uVar8 = (ulong)((ucs >> 4) - 0x240);
        pSVar6 = big5_uni2indx_page24;
        goto LAB_001fca82;
      }
      if (ucs - 0x3000 < 0x3e0) {
        uVar8 = (ulong)((ucs >> 4) - 0x300);
        pSVar6 = big5_uni2indx_page30;
        goto LAB_001fca82;
      }
      if (ucs - 0x4e00 < 0x51b0) {
        uVar8 = (ulong)((ucs >> 4) - 0x4e0);
        pSVar6 = big5_uni2indx_page4e;
        goto LAB_001fca82;
      }
      if ((ucs & 0xfffffff0) == 64000) {
        pSVar6 = big5_uni2indx_pagefa;
      }
      else {
        if (ucs - 0xfe00 < 0x170) {
          uVar8 = (ulong)((ucs >> 4) - 0xfe0);
          pSVar6 = big5_uni2indx_pagefe;
          goto LAB_001fca82;
        }
        pSVar6 = (Summary16 *)0x0;
      }
    }
    if (pSVar6 != (Summary16 *)0x0) {
      if ((pSVar6->used >> (ucs & 0xf) & 1) != 0) {
        uVar3 = (uint)pSVar6->used & (1 << (bVar9 & 0xf)) - 1U;
        uVar3 = (uVar3 >> 1 & 0x1555) + (uVar3 & 0x5555);
        uVar3 = (uVar3 >> 2 & 0x1333) + (uVar3 & 0x3333);
        uVar3 = (uVar3 >> 4 & 0x707) + (uVar3 & 0x707);
        *(unsigned_short *)s =
             big5_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] << 8 |
             big5_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] >> 8;
        return 0xf;
      }
    }
    break;
  case 0x10:
    if (ucs < 0x460) {
      uVar8 = (ulong)(ucs >> 4);
      pSVar6 = ksc5601_uni2indx_page00;
LAB_001fcc7b:
      pSVar6 = pSVar6 + uVar8;
    }
    else {
      if (ucs - 0x2000 < 0x670) {
        uVar8 = (ulong)((ucs >> 4) - 0x200);
        pSVar6 = ksc5601_uni2indx_page20;
        goto LAB_001fcc7b;
      }
      if (ucs - 0x3000 < 0x3e0) {
        uVar8 = (ulong)((ucs >> 4) - 0x300);
        pSVar6 = ksc5601_uni2indx_page30;
        goto LAB_001fcc7b;
      }
      if (ucs - 0x4e00 < 0x51a0) {
        uVar8 = (ulong)((ucs >> 4) - 0x4e0);
        pSVar6 = ksc5601_uni2indx_page4e;
        goto LAB_001fcc7b;
      }
      if (ucs - 0xac00 < 0x2ba0) {
        uVar8 = (ulong)((ucs >> 4) - 0xac0);
        pSVar6 = ksc5601_uni2indx_pageac;
        goto LAB_001fcc7b;
      }
      if (ucs - 0xf900 < 0x110) {
        uVar8 = (ulong)((ucs >> 4) - 0xf90);
        pSVar6 = ksc5601_uni2indx_pagef9;
        goto LAB_001fcc7b;
      }
      if (ucs - 0xff00 < 0xf0) {
        uVar8 = (ulong)((ucs >> 4) - 0xff0);
        pSVar6 = ksc5601_uni2indx_pageff;
        goto LAB_001fcc7b;
      }
      pSVar6 = (Summary16 *)0x0;
    }
    if (pSVar6 != (Summary16 *)0x0) {
      if ((pSVar6->used >> (ucs & 0xf) & 1) != 0) {
        uVar3 = (uint)pSVar6->used & (1 << (bVar9 & 0xf)) - 1U;
        uVar3 = (uVar3 >> 1 & 0x1555) + (uVar3 & 0x5555);
        uVar3 = (uVar3 >> 2 & 0x1333) + (uVar3 & 0x3333);
        uVar3 = (uVar3 >> 4 & 0x707) + (uVar3 & 0x707);
        *(unsigned_short *)s =
             ksc5601_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] << 8 |
             ksc5601_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] >> 8;
        return 0x10;
      }
    }
    break;
  case 0x11:
    if (ucs < 0x460) {
      uVar8 = (ulong)(ucs >> 4);
      pSVar6 = gb2312_uni2indx_page00;
LAB_001fcb2b:
      pSVar6 = pSVar6 + uVar8;
    }
    else {
      if (ucs - 0x2000 < 0x650) {
        uVar8 = (ulong)((ucs >> 4) - 0x200);
        pSVar6 = gb2312_uni2indx_page20;
        goto LAB_001fcb2b;
      }
      if (ucs - 0x3000 < 0x230) {
        uVar8 = (ulong)((ucs >> 4) - 0x300);
        pSVar6 = gb2312_uni2indx_page30;
        goto LAB_001fcb2b;
      }
      if (ucs - 0x4e00 < 0x4ef0) {
        uVar8 = (ulong)((ucs >> 4) - 0x4e0);
        pSVar6 = gb2312_uni2indx_page4e;
        goto LAB_001fcb2b;
      }
      if (ucs - 0x9e00 < 0x1b0) {
        uVar8 = (ulong)((ucs >> 4) - 0x9e0);
        pSVar6 = gb2312_uni2indx_page9e;
        goto LAB_001fcb2b;
      }
      if (ucs - 0xff00 < 0xf0) {
        uVar8 = (ulong)((ucs >> 4) - 0xff0);
        pSVar6 = gb2312_uni2indx_pageff;
        goto LAB_001fcb2b;
      }
      pSVar6 = (Summary16 *)0x0;
    }
    if (pSVar6 != (Summary16 *)0x0) {
      if ((pSVar6->used >> (ucs & 0xf) & 1) != 0) {
        uVar3 = (uint)pSVar6->used & (1 << (bVar9 & 0xf)) - 1U;
        uVar3 = (uVar3 >> 1 & 0x1555) + (uVar3 & 0x5555);
        uVar3 = (uVar3 >> 2 & 0x1333) + (uVar3 & 0x3333);
        uVar3 = (uVar3 >> 4 & 0x707) + (uVar3 & 0x707);
        *(unsigned_short *)s =
             gb2312_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] << 8 |
             gb2312_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] >> 8;
        return 0x11;
      }
    }
    break;
  case 0x12:
    if (ucs < 0x80) {
      if ((ucs != 0x5c) && (ucs != 0x7e)) goto LAB_001fc0f5;
    }
    else {
      if (ucs == 0x203e) {
        *s = '~';
        return 0x12;
      }
      if (ucs == 0xa5) {
        *s = '\\';
        return 0x12;
      }
    }
    if (0x3e < ucs - 0xff61) {
      return -1;
    }
    ucs = (uint)(byte)(bVar9 + 0x40);
LAB_001fc0f5:
    *s = (char)ucs;
    return 0x12;
  case 0x13:
    if (ucs < 0x100) {
      uVar8 = (ulong)(ucs >> 4);
      pSVar6 = jisx0208_uni2indx_page00;
LAB_001fcd9a:
      pSVar6 = pSVar6 + uVar8;
    }
    else {
      if (ucs - 0x300 < 0x160) {
        uVar8 = (ulong)((ucs >> 4) - 0x30);
        pSVar6 = jisx0208_uni2indx_page03;
        goto LAB_001fcd9a;
      }
      if (ucs - 0x2000 < 800) {
        uVar8 = (ulong)((ucs >> 4) - 0x200);
        pSVar6 = jisx0208_uni2indx_page20;
        goto LAB_001fcd9a;
      }
      if (ucs - 0x2500 < 0x170) {
        uVar8 = (ulong)((ucs >> 4) - 0x250);
        pSVar6 = jisx0208_uni2indx_page25;
        goto LAB_001fcd9a;
      }
      if ((ucs & 0xffffff00) == 0x3000) {
        uVar8 = (ulong)((ucs >> 4) - 0x300);
        pSVar6 = jisx0208_uni2indx_page30;
        goto LAB_001fcd9a;
      }
      if (ucs - 0x4e00 < 0x51b0) {
        uVar8 = (ulong)((ucs >> 4) - 0x4e0);
        pSVar6 = jisx0208_uni2indx_page4e;
        goto LAB_001fcd9a;
      }
      if (ucs - 0xff00 < 0xf0) {
        uVar8 = (ulong)((ucs >> 4) - 0xff0);
        pSVar6 = jisx0208_uni2indx_pageff;
        goto LAB_001fcd9a;
      }
      pSVar6 = (Summary16 *)0x0;
    }
    if (pSVar6 != (Summary16 *)0x0) {
      if ((pSVar6->used >> (ucs & 0xf) & 1) != 0) {
        uVar3 = (uint)pSVar6->used & (1 << (bVar9 & 0xf)) - 1U;
        uVar3 = (uVar3 >> 1 & 0x1555) + (uVar3 & 0x5555);
        uVar3 = (uVar3 >> 2 & 0x1333) + (uVar3 & 0x3333);
        uVar3 = (uVar3 >> 4 & 0x707) + (uVar3 & 0x707);
        *(unsigned_short *)s =
             jisx0208_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] << 8 |
             jisx0208_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] >> 8;
        return 0x13;
      }
    }
    break;
  case 0x14:
    if (ucs < 0x460) {
      uVar8 = (ulong)(ucs >> 4);
      pSVar6 = jisx0212_uni2indx_page00;
LAB_001fc3dd:
      pSVar6 = pSVar6 + uVar8;
    }
    else {
      if (ucs - 0x2100 < 0x30) {
        uVar8 = (ulong)((ucs >> 4) - 0x210);
        pSVar6 = jisx0212_uni2indx_page21;
        goto LAB_001fc3dd;
      }
      if (ucs - 0x4e00 < 0x51b0) {
        uVar8 = (ulong)((ucs >> 4) - 0x4e0);
        pSVar6 = jisx0212_uni2indx_page4e;
        goto LAB_001fc3dd;
      }
      pSVar6 = (Summary16 *)0x0;
    }
    if (pSVar6 != (Summary16 *)0x0) {
      if ((pSVar6->used >> (ucs & 0xf) & 1) != 0) {
        uVar3 = (uint)pSVar6->used & (1 << (bVar9 & 0xf)) - 1U;
        uVar3 = (uVar3 >> 1 & 0x1555) + (uVar3 & 0x5555);
        uVar3 = (uVar3 >> 2 & 0x1333) + (uVar3 & 0x3333);
        uVar3 = (uVar3 >> 4 & 0x707) + (uVar3 & 0x707);
        *(unsigned_short *)s =
             jisx0212_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] << 8 |
             jisx0212_2charset[((uVar3 >> 8) + uVar3 & 0xff) + (uint)pSVar6->indx] >> 8;
        return 0x14;
      }
    }
    break;
  case 0x15:
    if (ucs < 0xf8) {
      if (ucs < 0x20) {
        return -1;
      }
      *s = '\0';
      uVar8 = (ulong)(ucs - 0x20);
      pcVar5 = " !";
    }
    else {
      if (ucs < 0x193) {
        if (ucs != 0x192) {
          return -1;
        }
        s[0] = '\0';
        s[1] = -0x5a;
        return 0x15;
      }
      if (ucs < 0x3d7) {
        if (ucs < 0x391) {
          return -1;
        }
        *s = '\0';
        uVar8 = (ulong)(ucs - 0x391);
        pcVar5 = "ABGDEZHQIKLMNXOPR";
      }
      else {
        if (0x232a < ucs) {
          if (ucs < 0x25cb) {
            if (ucs == 0x25ca) {
              s[0] = '\0';
              s[1] = -0x20;
              return 0x15;
            }
            return -1;
          }
          if (0x2666 < ucs) {
            if (ucs < 0xf6dc) {
              if (ucs < 0xf6d9) {
                return -1;
              }
              *s = '\0';
              cVar1 = unicode_to_symbol_1b_F6D9[ucs - 0xf6d9];
            }
            else {
              if (0x19 < ucs - 0xf8e5) {
                return -1;
              }
              *s = '\0';
              cVar1 = unicode_to_symbol_1b_F8E5[ucs - 0xf8e5];
            }
            s[1] = cVar1;
            return 0x15;
          }
          if (ucs < 0x2660) {
            return -1;
          }
          *s = '\0';
          uVar10 = (ulong)(ucs - 0x2660);
          s[1] = unicode_to_symbol_1b_2660[uVar10];
          iVar4 = 0x15;
          uVar8 = 0x16;
          goto LAB_001fc304;
        }
        if (ucs < 0x2022) {
          return -1;
        }
        *s = '\0';
        uVar8 = (ulong)(ucs - 0x2022);
        pcVar5 = unicode_to_symbol_1b_2022;
      }
    }
    uVar2 = pcVar5[uVar8];
    s[1] = uVar2;
    iVar4 = 0x15;
    goto LAB_001fbfb9;
  case 0x16:
    if (ucs < 0xa1) {
      if (ucs < 0x20) {
        return -1;
      }
      *s = '\0';
      s[1] = " "[ucs - 0x20];
      if ((ucs - 0x20 & 0xffffff7f) != 0) {
        return -1;
      }
      return 0x16;
    }
    if (ucs < 0x2196) {
      if (ucs < 0x2192) {
        return -1;
      }
      *s = '\0';
      s[1] = unicode_to_dingbats_1b_2192[ucs - 0x2192];
      if (ucs - 0x2192 == 1) {
        return -1;
      }
      return 0x16;
    }
    if (ucs < 0x246a) {
      if (ucs < 0x2460) {
        return -1;
      }
      *s = '\0';
      cVar1 = unicode_to_dingbats_1b_2460[ucs - 0x2460];
LAB_001fc568:
      s[1] = cVar1;
      return 0x16;
    }
    if (ucs < 0x2667) {
      if (ucs < 0x25a0) {
        return -1;
      }
      *s = '\0';
      uVar3 = ucs - 0x25a0;
      pcVar5 = "n";
    }
    else {
      if (0x27be < ucs) {
        if (0xd < ucs - 0xf8d7) {
          return -1;
        }
        *s = '\0';
        cVar1 = unicode_to_dingbats_1b_F8D7[ucs - 0xf8d7];
        goto LAB_001fc568;
      }
      if (ucs < 0x2701) {
        return -1;
      }
      *s = '\0';
      uVar3 = ucs - 0x2701;
      pcVar5 = "!\"#$";
    }
    uVar2 = pcVar5[uVar3];
    s[1] = uVar2;
    iVar4 = 0x16;
LAB_001fbfb9:
    if (uVar2 != '\0') {
      return iVar4;
    }
    break;
  case 0x17:
    if (ucs < 0x80) {
      *s = bVar9;
      return 0x17;
    }
    if (ucs - 0xa0 < 0x58) {
      uVar8 = (ulong)(ucs - 0xa0);
      puVar7 = koi8_r_page00;
LAB_001fc826:
      puVar7 = puVar7 + uVar8;
LAB_001fc829:
      uVar2 = *puVar7;
    }
    else {
      if (ucs - 0x400 < 0x98) {
        uVar8 = (ulong)(ucs - 0x400);
        puVar7 = "";
        goto LAB_001fc826;
      }
      if (ucs - 0x2218 < 0x50) {
        uVar8 = (ulong)(ucs - 0x2218);
        puVar7 = "";
        goto LAB_001fc826;
      }
      if ((ucs & 0xfffffff8) == 0x2320) {
        puVar7 = koi8_r_page23 + (ucs - 0x2320);
        goto LAB_001fc829;
      }
      if (ucs - 0x2500 < 0xa8) {
        uVar8 = (ulong)(ucs - 0x2500);
        puVar7 = koi8_u_page25;
        goto LAB_001fc826;
      }
      uVar2 = '\0';
    }
    if (uVar2 != '\0') {
      *s = uVar2;
      return 0x17;
    }
    break;
  case 0x18:
    if (ucs < 0x80) {
      *s = bVar9;
      return 0x18;
    }
    if ((ucs & 0xffffffe0) == 0xa0) {
      uVar2 = cp1251_page00[ucs - 0xa0];
    }
    else {
      uVar3 = ucs - 0x400;
      if (uVar3 < 0x98) {
        puVar7 = "";
      }
      else {
        uVar3 = ucs - 0x2010;
        if (0x2f < uVar3) {
          if (ucs == 0x20ac) {
            uVar2 = 0x88;
          }
          else if (ucs == 0x2122) {
            uVar2 = 0x99;
          }
          else if (ucs == 0x2116) {
            uVar2 = 0xb9;
          }
          else {
            uVar2 = '\0';
          }
          goto LAB_001fc687;
        }
        puVar7 = "";
      }
      uVar2 = puVar7[uVar3];
    }
LAB_001fc687:
    if (uVar2 != '\0') {
      *s = uVar2;
      return 0x18;
    }
    return -1;
  case 0x19:
    if (ucs < 0x80 || ucs == 0xa0) {
      *s = bVar9;
    }
    else {
      if (ucs - 0xe00 < 0x60) {
        uVar2 = ""[ucs - 0xe00];
      }
      else {
        uVar2 = '\0';
      }
      if (uVar2 == '\0') {
        return -1;
      }
      *s = uVar2;
    }
    return 0x19;
  }
  return -1;
}

Assistant:

static int ucs2fontmap(char *s, unsigned int ucs, int enc) {
  switch(enc) {
  case 0:	/* iso10646-1 */
    s[0] = (char) ((ucs & 0xFF00) >> 8);
    s[1] = (char) (ucs & 0xFF);
    return 0;
  case 1:	/* iso8859-1 */
    if (ucs <= 0x00FF) {
      if (ucs >= 0x0001) {
        s[0] = 0;
        s[1] = (char) (ucs & 0xFF);
        return 1;
      }
    }
    break;
  case 2:	/* iso8859-2 */
    if (ucs <= 0x00a0) {
      s[0] = 0;
      s[1] = (char) ucs;
      return 2;
    } else if (ucs < 0x0180) {
      if (ucs >= 0x00a0) {
	s[0] = 0;
	s[1] = (char)  iso8859_2_page00[ucs-0x00a0];
        if (s[1]) return 2;
      }
    } else if (ucs < 0x02e0) {
      if (ucs >= 0x02c0) {
        s[0] = 0;
        s[1] = (char) iso8859_2_page02[ucs-0x02c0];
        if (s[1]) return 2;
      }	
    }
    break;
  case 3:	/* iso8859-3 */
    if (iso8859_3_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 3;
    } 
    break;
  case 4:	/* iso8859-4 */
    if (iso8859_4_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 4;
    } 
    break;
  case 5:	/* iso8859-5 */
    if (iso8859_5_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 5;
    } 
    break;
  case 6:	/* iso8859-6 */
    if (iso8859_6_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 6;
    } 
    break;
  case 7:	/* iso8859-7 */
    if (iso8859_7_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 7;
    } 
    break;
  case 8:	/* iso8859-8 */
    if (iso8859_8_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 8;
    } 
    break;
  case 9:	/* iso8859-9 */
    if (iso8859_9_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 9;
    } 
    break;
  case 10:	/* iso8859-10 */
    if (iso8859_10_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 10;
    } 
    break;
  case 25:	/* iso8859-11 */
    if (iso8859_11_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 25;
    } 
    break;
  case 11:	/* iso8859-13 */
    if (iso8859_13_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 11;
    } 
    break;
  case 12:	/* iso8859-14 */
    if (iso8859_14_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 12;
    } 
    break;
  case 13:	/* iso8859-15 */
    if (iso8859_15_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 13;
    } 
    break;
  case 14:	/* koi8-r */
    if (koi8_r_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 14;
    } 
    break;
  case 15:	/* big5 */
    if (big5_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 15;
    } 
    break;
  case 16:	/* ksc5601.1987-0 */
    if (ksc5601_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 16;
    } 
    break;
  case 17:	/* gb2312.1980-0 */
    if (gb2312_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 17;
    } 
    break;
  case 18:	/* jisx0201.1976-0 */
    if (jisx0201_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 18;
    } 
    break;
  case 19:	/* jisx0208.1983-0 */
    if (jisx0208_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 19;
    } 
    break;
  case 20:	/* jisx0212.1990-0 */
    if (jisx0212_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 20;
    } 
    break;
  case 21:	/* symbol */
    if (ucs <= 0x00F7) {
      if (ucs >= 0x0020) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0020[ucs - 0x0020];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x0192) {
      if (ucs >= 0x0192) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0192[ucs - 0x0192];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x03D6) {
      if (ucs >= 0x0391) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_0391[ucs - 0x0391];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x232A) {
      if (ucs >= 0x2022) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_2022[ucs - 0x2022];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x25CA) {
      if (ucs >= 0x25CA) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_25CA[ucs - 0x25CA];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0x2666) {
      if (ucs >= 0x2660) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_2660[ucs - 0x2660];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0xF6DB) {
      if (ucs >= 0xF6D9) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_F6D9[ucs - 0xF6D9];
        if (s[1]) return 21;
      }
    } else if (ucs <= 0xF8FE) {
      if (ucs >= 0xF8E5) {
        s[0] = 0;
        s[1] = unicode_to_symbol_1b_F8E5[ucs - 0xF8E5];
        if (s[1]) return 21;
      }
    }
    break;
  case 22:	/* dingbats */
    if (ucs <= 0x00A0) {
      if (ucs >= 0x0020) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_0020[ucs - 0x0020];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2195) {
      if (ucs >= 0x2192) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2192[ucs - 0x2192];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2469) {
      if (ucs >= 0x2460) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2460[ucs - 0x2460];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x2666) {
      if (ucs >= 0x25A0) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_25A0[ucs - 0x25A0];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0x27BE) {
      if (ucs >= 0x2701) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_2701[ucs - 0x2701];
        if (s[1]) return 22;
      }
    } else if (ucs <= 0xF8E4) {
      if (ucs >= 0xF8D7) {
        s[0] = 0;
        s[1] = unicode_to_dingbats_1b_F8D7[ucs - 0xF8D7];
        if (s[1]) return 22;
      }
    }
    break;
  case 23:	/* koi8-u */
    if (koi8_u_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 23;
    } 
    break;
  case 24:	/* microsoft-cp1251 */
    if (cp1251_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 24;
    } 
    break;
  case 26: /* gbk/cp936ext */
    if (cp936ext_wctomb(NULL, (unsigned char*)s, ucs, 2) > 0) {
      return 26;
    }
    break;
  default:
    break;
  };
  return -1;
}